

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printTry(JSPrinter *this,Ref node)

{
  undefined8 *puVar1;
  uint uVar2;
  Value *local_20;
  Ref node_local;
  
  local_20 = node.inst;
  emit(this,"try ");
  uVar2 = (uint)&local_20;
  puVar1 = (undefined8 *)cashew::Ref::operator[](uVar2);
  printBlock(this,(Value *)*puVar1);
  emit(this," catch (");
  puVar1 = (undefined8 *)cashew::Ref::operator[](uVar2);
  printName(this,(Value *)*puVar1);
  emit(this,") ");
  puVar1 = (undefined8 *)cashew::Ref::operator[](uVar2);
  printBlock(this,(Value *)*puVar1);
  return;
}

Assistant:

void printTry(Ref node) {
    emit("try ");
    printBlock(node[1]);
    emit(" catch (");
    printName(node[2]);
    emit(") ");
    printBlock(node[3]);
  }